

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::AlignmentTests_NoSource_Test::TestBody(AlignmentTests_NoSource_Test *this)

{
  bool bVar1;
  char *in_RCX;
  string_view sv;
  AssertHelper local_78;
  Message local_70 [2];
  invalid_argument *anon_var_0;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  Alignment local_48;
  byte local_19;
  char *pcStack_18;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  AlignmentTests_NoSource_Test *this_local;
  
  gtest_msg.value = (char *)this;
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffffe8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffffe8);
  if (bVar1) {
    local_19 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,"-3");
      sv._M_str = in_RCX;
      sv._M_len = (size_t)local_58._M_str;
      readAlignment(&local_48,(thrax *)local_58._M_len,sv);
      std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::~vector(&local_48);
    }
    if ((local_19 & 1) != 0) {
      return;
    }
    pcStack_18 = 
    "Expected: readAlignment(\"-3\") throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_70);
  testing::internal::AssertHelper::AssertHelper
            (&local_78,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/alignment_test.cpp"
             ,0x49,pcStack_18);
  testing::internal::AssertHelper::operator=(&local_78,local_70);
  testing::internal::AssertHelper::~AssertHelper(&local_78);
  testing::Message::~Message(local_70);
  return;
}

Assistant:

TEST(AlignmentTests, NoSource) {
  EXPECT_THROW(readAlignment("-3"), std::invalid_argument);
}